

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Session.cpp
# Opt level: O2

bool FIX::Session::sendToTarget(Message *message,string *sender,string *target,string *qualifier)

{
  bool bVar1;
  FieldBase FStack_d8;
  FieldBase local_78;
  
  SenderCompID::SenderCompID((SenderCompID *)&local_78,sender);
  TargetCompID::TargetCompID((TargetCompID *)&FStack_d8,target);
  bVar1 = sendToTarget(message,(SenderCompID *)&local_78,(TargetCompID *)&FStack_d8,qualifier);
  FieldBase::~FieldBase(&FStack_d8);
  FieldBase::~FieldBase(&local_78);
  return bVar1;
}

Assistant:

bool Session::sendToTarget
( Message& message, const std::string& sender, const std::string& target,
  const std::string& qualifier )
EXCEPT ( SessionNotFound )
{
  return sendToTarget( message, SenderCompID( sender ),
                       TargetCompID( target ), qualifier );
}